

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O2

void Eigen::internal::
     make_block_householder_triangular_factor<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
               (Matrix<double,__1,__1,_1,__1,__1> *triFactor,
               Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *vectors,
               VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *hCoeffs)

{
  double dVar1;
  double dVar2;
  long lVar3;
  Scalar *pSVar4;
  Index j;
  long lVar5;
  ulong col;
  Type *pTVar6;
  Rhs *pRVar7;
  ulong index;
  long lVar8;
  byte bVar9;
  CoeffReturnType CVar10;
  Type *local_530;
  CoeffReturnType local_528;
  Scalar z;
  Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
  local_4b8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_> local_450 [56];
  Type local_418;
  StorageBaseType local_380 [152];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  local_2e8;
  Type local_228;
  Type local_1c0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>
  local_158;
  
  bVar9 = 0;
  lVar3 = (vectors->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value;
  if ((((triFactor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
        m_rows == lVar3) &&
      ((triFactor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
       m_cols == lVar3)) &&
     (lVar3 <= (vectors->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_rows.m_value)) {
    for (index = lVar3 - 1U; -1 < (long)index; index = index - 1) {
      lVar8 = lVar3 + ~index;
      if (0 < lVar8) {
        lVar5 = ~index + (vectors->
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                         .m_rows.m_value;
        local_528 = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
                    ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                                  *)hCoeffs,index);
        local_528 = -local_528;
        Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>
        ::Block(&local_4b8,vectors,index);
        DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
        ::tail<long>(&local_418,
                     (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                      *)&local_4b8,lVar5);
        memcpy(local_380,&local_418,0x98);
        Eigen::operator*(&local_2e8,&local_528,local_380);
        DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        bottomRightCorner<long,long>(&local_1c0,vectors,lVar5,lVar8);
        pTVar6 = &local_1c0;
        pRVar7 = (Rhs *)&z;
        for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pRVar7->m_matrix).
          super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_data = (pTVar6->
                    super_BlockImpl<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                    .m_data;
          pTVar6 = (Type *)((long)pTVar6 + ((ulong)bVar9 * -2 + 1) * 8);
          pRVar7 = (Rhs *)((long)pRVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_5U>,_0>
        ::Product(&local_158,&local_2e8,(Rhs *)&z);
        Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_450,
                   triFactor,index);
        DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::tail<long>
                  (&local_228,local_450,lVar8);
        local_530 = &local_228;
        NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>,Eigen::MatrixBase>
        ::operator=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>,Eigen::MatrixBase>
                     *)&local_530,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>_>
                     *)&local_158);
        lVar8 = 0;
        for (col = lVar3 - 1U; (long)index < (long)col; col = col - 1) {
          pSVar4 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,index,col);
          dVar1 = *pSVar4;
          z = dVar1;
          pSVar4 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,col,col);
          dVar2 = *pSVar4;
          pSVar4 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,index,col);
          *pSVar4 = dVar1 * dVar2;
          if (0 < lVar8) {
            Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_418,
                       triFactor,col);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>((Type *)&local_2e8,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_418,lVar8);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
                              *)&local_158,&z,(StorageBaseType *)&local_2e8);
            Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_4b8,
                       triFactor,index);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>((Type *)local_380,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_4b8,lVar8);
            MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>>
            ::operator+=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
                          *)local_380,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>_>
                          *)&local_158);
          }
          lVar8 = lVar8 + 1;
        }
      }
      CVar10 = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                             *)hCoeffs,index);
      pSVar4 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)triFactor,
                          index,index);
      *pSVar4 = CVar10;
    }
    return;
  }
  __assert_fail("triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Householder/BlockHouseholder.h"
                ,0x36,
                "void Eigen::internal::make_block_householder_triangular_factor(TriangularFactorType &, const VectorsType &, const CoeffsType &) [TriangularFactorType = Eigen::Matrix<double, -1, -1, 1, -1, -1>, VectorsType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, CoeffsType = Eigen::VectorBlock<const Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

void make_block_householder_triangular_factor(TriangularFactorType& triFactor, const VectorsType& vectors, const CoeffsType& hCoeffs)
{
  const Index nbVecs = vectors.cols();
  eigen_assert(triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs);

  for(Index i = nbVecs-1; i >=0 ; --i)
  {
    Index rs = vectors.rows() - i - 1;
    Index rt = nbVecs-i-1;

    if(rt>0)
    {
      triFactor.row(i).tail(rt).noalias() = -hCoeffs(i) * vectors.col(i).tail(rs).adjoint()
                                                        * vectors.bottomRightCorner(rs, rt).template triangularView<UnitLower>();
            
      // FIXME use the following line with .noalias() once the triangular product can work inplace
      // triFactor.row(i).tail(rt) = triFactor.row(i).tail(rt) * triFactor.bottomRightCorner(rt,rt).template triangularView<Upper>();
      for(Index j=nbVecs-1; j>i; --j)
      {
        typename TriangularFactorType::Scalar z = triFactor(i,j);
        triFactor(i,j) = z * triFactor(j,j);
        if(nbVecs-j-1>0)
          triFactor.row(i).tail(nbVecs-j-1) += z * triFactor.row(j).tail(nbVecs-j-1);
      }
      
    }
    triFactor(i,i) = hCoeffs(i);
  }
}